

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::constant_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,
          bool inside_block_like_struct_scope,bool inside_struct_scope)

{
  SPIRConstantOp *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  SPIRUndef *pSVar5;
  SPIRConstantOp *pSVar6;
  size_t sVar7;
  char (*ts_1) [6];
  char (*ts_1_00) [4];
  char *pcVar8;
  char (*in_R9) [2];
  byte local_721;
  spirv_cross local_708 [32];
  string local_6e8;
  undefined1 local_6c8 [8];
  SPIRType tmp_type_2;
  string local_558 [36];
  uint local_534;
  undefined1 local_530 [4];
  uint32_t col;
  undefined1 local_509;
  spirv_cross local_508 [32];
  string local_4e8;
  undefined1 local_4c8 [8];
  SPIRType tmp_type_1;
  spirv_cross local_370 [39];
  allocator local_349;
  spirv_cross local_348 [39];
  allocator local_321;
  string local_320;
  uint32_t local_2fc;
  string local_2f8 [32];
  SPIRConstant *local_2d8;
  SPIRConstant *subc;
  string local_2b0 [32];
  SPIRConstantOp *local_290;
  SPIRConstantOp *op;
  TypedID<(spirv_cross::Types)3> *elem;
  TypedID<(spirv_cross::Types)3> *__end3;
  TypedID<(spirv_cross::Types)3> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *__range3;
  undefined1 local_260 [4];
  uint32_t subconstant_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  SPIRType tmp_type;
  SPIRType *p_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  byte local_45;
  bool needs_trailing_tracket;
  byte local_32;
  undefined1 local_31;
  bool array_type_decays;
  SPIRType *pSStack_30;
  SPIRType *type;
  bool inside_struct_scope_local;
  SPIRConstant *pSStack_20;
  bool inside_block_like_struct_scope_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  type._6_1_ = inside_struct_scope;
  type._7_1_ = inside_block_like_struct_scope;
  pSStack_20 = c;
  c_local = (SPIRConstant *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
  pSStack_30 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
  bVar2 = Compiler::is_pointer(&this->super_Compiler,pSStack_30);
  if (bVar2) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(this->backend).null_pointer_literal);
  }
  else {
    bVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::empty
                      (&(pSStack_20->subconstants).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>);
    if (bVar2) {
      if ((pSStack_30->basetype == Struct) &&
         (sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(pSStack_30->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
         sVar7 == 0)) {
        if (((this->backend).supports_empty_struct & 1U) == 0) {
          if (((this->backend).use_typed_initializer_list & 1U) == 0) {
            if (((this->backend).use_initializer_list & 1U) == 0) {
              ts_1_00 = (char (*) [4])0x0;
              (*(this->super_Compiler)._vptr_Compiler[0x13])(local_370,this,pSStack_30);
              join<std::__cxx11::string,char_const(&)[4]>
                        (__return_storage_ptr__,local_370,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x67bd1a,ts_1_00);
              ::std::__cxx11::string::~string((string *)local_370);
            }
            else {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)__return_storage_ptr__,"{ 0 }",&local_349);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_349);
            }
          }
          else {
            ts_1 = (char (*) [6])0x0;
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_348,this,pSStack_30);
            join<std::__cxx11::string,char_const(&)[6]>
                      (__return_storage_ptr__,local_348,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"{ 0 }",
                       ts_1);
            ::std::__cxx11::string::~string((string *)local_348);
          }
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"{ }",&local_321);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
        }
      }
      else {
        uVar3 = SPIRConstant::columns(pSStack_20);
        if (uVar3 == 1) {
          tmp_type_1.member_name_cache._M_h._M_single_bucket._7_1_ = 0;
          (*(this->super_Compiler)._vptr_Compiler[0x19])(__return_storage_ptr__,this,pSStack_20,0);
          if ((((type._6_1_ & 1) != 0) &&
              ((this->backend).boolean_in_struct_remapped_type != Boolean)) &&
             (pSStack_30->basetype == Boolean)) {
            SPIRType::SPIRType((SPIRType *)local_4c8,pSStack_30);
            tmp_type_1.super_IVariant.self.id = (this->backend).boolean_in_struct_remapped_type;
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_508,this,local_4c8,0);
            join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      (&local_4e8,local_508,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60
                       ,(char (*) [2])__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405
                       ,in_R9);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_4e8)
            ;
            ::std::__cxx11::string::~string((string *)&local_4e8);
            ::std::__cxx11::string::~string((string *)local_508);
            SPIRType::~SPIRType((SPIRType *)local_4c8);
          }
        }
        else {
          local_509 = 0;
          (*(this->super_Compiler)._vptr_Compiler[0x13])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530,
                     this,pSStack_30,0);
          ::std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_530,"(");
          ::std::__cxx11::string::~string((string *)local_530);
          for (local_534 = 0; uVar4 = local_534, uVar3 = SPIRConstant::columns(pSStack_20),
              uVar4 < uVar3; local_534 = local_534 + 1) {
            uVar3 = SPIRConstant::specialization_constant_id(pSStack_20,local_534);
            if (uVar3 == 0) {
              (*(this->super_Compiler)._vptr_Compiler[0x19])
                        (&tmp_type_2.member_name_cache._M_h._M_single_bucket,this,pSStack_20,
                         (ulong)local_534);
              ::std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,
                         (string *)&tmp_type_2.member_name_cache._M_h._M_single_bucket);
              ::std::__cxx11::string::~string
                        ((string *)&tmp_type_2.member_name_cache._M_h._M_single_bucket);
            }
            else {
              uVar3 = SPIRConstant::specialization_constant_id(pSStack_20,local_534);
              (*(this->super_Compiler)._vptr_Compiler[6])(local_558,this,(ulong)uVar3,1);
              ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_558);
              ::std::__cxx11::string::~string(local_558);
            }
            uVar4 = local_534 + 1;
            uVar3 = SPIRConstant::columns(pSStack_20);
            if (uVar4 < uVar3) {
              ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
            }
          }
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
          if ((((type._6_1_ & 1) != 0) &&
              ((this->backend).boolean_in_struct_remapped_type != Boolean)) &&
             (pSStack_30->basetype == Boolean)) {
            SPIRType::SPIRType((SPIRType *)local_6c8,pSStack_30);
            tmp_type_2.super_IVariant.self.id = (this->backend).boolean_in_struct_remapped_type;
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_708,this,local_6c8,0);
            join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      (&local_6e8,local_708,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60
                       ,(char (*) [2])__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405
                       ,in_R9);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_6e8)
            ;
            ::std::__cxx11::string::~string((string *)&local_6e8);
            ::std::__cxx11::string::~string((string *)local_708);
            SPIRType::~SPIRType((SPIRType *)local_6c8);
          }
        }
      }
    }
    else {
      local_31 = 0;
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_721 = 0;
      if ((type._7_1_ & 1) != 0) {
        bVar2 = Compiler::is_array(&this->super_Compiler,pSStack_30);
        local_721 = 0;
        if (bVar2) {
          local_721 = (this->backend).array_is_value_type_in_buffer_blocks ^ 0xff;
        }
      }
      local_32 = local_721 & 1;
      local_45 = 0;
      if (((((this->backend).use_initializer_list & 1U) == 0) ||
          (((this->backend).use_typed_initializer_list & 1U) == 0)) ||
         ((pSStack_30->basetype != Struct ||
          (bVar2 = Compiler::is_array(&this->super_Compiler,pSStack_30), bVar2)))) {
        if ((((((this->backend).use_initializer_list & 1U) == 0) ||
             (((this->backend).use_typed_initializer_list & 1U) == 0)) ||
            (((this->backend).array_is_value_type & 1U) == 0)) ||
           ((bVar2 = Compiler::is_array(&this->super_Compiler,pSStack_30), !bVar2 ||
            ((local_32 & 1) != 0)))) {
          if (((this->backend).use_initializer_list & 1U) == 0) {
            type_to_glsl_constructor_abi_cxx11_((string *)local_260,this,pSStack_30);
            ::std::operator+(&local_240,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_260,"(");
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_240)
            ;
            ::std::__cxx11::string::~string((string *)&local_240);
            ::std::__cxx11::string::~string((string *)local_260);
          }
          else {
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
          }
        }
        else {
          tmp_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)pSStack_30;
          SPIRType::SPIRType((SPIRType *)local_1e0,OpNop);
          if ((((type._6_1_ & 1) != 0) &&
              ((this->backend).boolean_in_struct_remapped_type != Boolean)) &&
             (pSStack_30->basetype == Boolean)) {
            SPIRType::operator=((SPIRType *)local_1e0,pSStack_30);
            tmp_type.super_IVariant.self.id = (this->backend).boolean_in_struct_remapped_type;
            tmp_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)local_1e0;
          }
          type_to_glsl_constructor_abi_cxx11_
                    (&local_220,this,(SPIRType *)tmp_type.member_name_cache._M_h._M_single_bucket);
          ::std::operator+(&local_200,&local_220,"({ ");
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_200);
          ::std::__cxx11::string::~string((string *)&local_200);
          ::std::__cxx11::string::~string((string *)&local_220);
          local_45 = 1;
          SPIRType::~SPIRType((SPIRType *)local_1e0);
        }
      }
      else {
        type_to_glsl_constructor_abi_cxx11_((string *)&p_type,this,pSStack_30);
        ::std::operator+(&local_68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &p_type,"{ ");
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
        ::std::__cxx11::string::~string((string *)&p_type);
      }
      __range3._4_4_ = 0;
      __begin3 = (TypedID<(spirv_cross::Types)3> *)&pSStack_20->subconstants;
      __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::begin
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)__begin3);
      elem = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::end
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)__begin3);
      for (; __end3 != elem; __end3 = __end3 + 1) {
        op = (SPIRConstantOp *)__end3;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end3);
        local_290 = Compiler::maybe_get<spirv_cross::SPIRConstantOp>(&this->super_Compiler,uVar3);
        if (local_290 == (SPIRConstantOp *)0x0) {
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
          pSVar5 = Compiler::maybe_get<spirv_cross::SPIRUndef>(&this->super_Compiler,uVar3);
          if (pSVar5 == (SPIRUndef *)0x0) {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
            local_2d8 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar3);
            if ((local_2d8->specialization & 1U) != 0) {
              uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
              bVar2 = expression_is_forwarded(this,uVar3);
              if (!bVar2) {
                uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
                (*(this->super_Compiler)._vptr_Compiler[6])(local_2f8,this,(ulong)uVar3,1);
                ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_2f8);
                ::std::__cxx11::string::~string(local_2f8);
                goto LAB_005215a0;
              }
            }
            bVar2 = Compiler::is_array(&this->super_Compiler,pSStack_30);
            if ((!bVar2) && (pSStack_30->basetype == Struct)) {
              local_2fc = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(pSStack_30->super_IVariant).self);
              type._7_1_ = Compiler::has_member_decoration
                                     (&this->super_Compiler,(TypeID)local_2fc,__range3._4_4_,
                                      DecorationOffset);
            }
            if (pSStack_30->basetype == Struct) {
              type._6_1_ = 1;
            }
            constant_expression_abi_cxx11_
                      (&local_320,this,local_2d8,(bool)(type._7_1_ & 1),(bool)(type._6_1_ & 1));
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_320);
            ::std::__cxx11::string::~string((string *)&local_320);
          }
          else {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
            (*(this->super_Compiler)._vptr_Compiler[6])(&subc,this,(ulong)uVar3,1);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&subc);
            ::std::__cxx11::string::~string((string *)&subc);
          }
        }
        else {
          (*(this->super_Compiler)._vptr_Compiler[0x18])(local_2b0,this,local_290);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_2b0);
          ::std::__cxx11::string::~string(local_2b0);
        }
LAB_005215a0:
        pSVar1 = op;
        pSVar6 = (SPIRConstantOp *)
                 VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::back
                           (&(pSStack_20->subconstants).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>);
        if (pSVar1 != pSVar6) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
        __range3._4_4_ = __range3._4_4_ + 1;
      }
      pcVar8 = ")";
      if (((this->backend).use_initializer_list & 1U) != 0) {
        pcVar8 = " }";
      }
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar8);
      if ((local_45 & 1) != 0) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression(const SPIRConstant &c,
                                         bool inside_block_like_struct_scope,
                                         bool inside_struct_scope)
{
	auto &type = get<SPIRType>(c.constant_type);

	if (is_pointer(type))
	{
		return backend.null_pointer_literal;
	}
	else if (!c.subconstants.empty())
	{
		// Handles Arrays and structures.
		string res;

		// Only consider the decay if we are inside a struct scope where we are emitting a member with Offset decoration.
		// Outside a block-like struct declaration, we can always bind to a constant array with templated type.
		// Should look at ArrayStride here as well, but it's possible to declare a constant struct
		// with Offset = 0, using no ArrayStride on the enclosed array type.
		// A particular CTS test hits this scenario.
		bool array_type_decays = inside_block_like_struct_scope &&
		                         is_array(type) &&
		                         !backend.array_is_value_type_in_buffer_blocks;

		// Allow Metal to use the array<T> template to make arrays a value type
		bool needs_trailing_tracket = false;
		if (backend.use_initializer_list && backend.use_typed_initializer_list && type.basetype == SPIRType::Struct &&
		    !is_array(type))
		{
			res = type_to_glsl_constructor(type) + "{ ";
		}
		else if (backend.use_initializer_list && backend.use_typed_initializer_list && backend.array_is_value_type &&
		         is_array(type) && !array_type_decays)
		{
			const auto *p_type = &type;
			SPIRType tmp_type { OpNop };

			if (inside_struct_scope &&
			    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
			    type.basetype == SPIRType::Boolean)
			{
				tmp_type = type;
				tmp_type.basetype = backend.boolean_in_struct_remapped_type;
				p_type = &tmp_type;
			}

			res = type_to_glsl_constructor(*p_type) + "({ ";
			needs_trailing_tracket = true;
		}
		else if (backend.use_initializer_list)
		{
			res = "{ ";
		}
		else
		{
			res = type_to_glsl_constructor(type) + "(";
		}

		uint32_t subconstant_index = 0;
		for (auto &elem : c.subconstants)
		{
			if (auto *op = maybe_get<SPIRConstantOp>(elem))
			{
				res += constant_op_expression(*op);
			}
			else if (maybe_get<SPIRUndef>(elem) != nullptr)
			{
				res += to_name(elem);
			}
			else
			{
				auto &subc = get<SPIRConstant>(elem);
				if (subc.specialization && !expression_is_forwarded(elem))
					res += to_name(elem);
				else
				{
					if (!is_array(type) && type.basetype == SPIRType::Struct)
					{
						// When we get down to emitting struct members, override the block-like information.
						// For constants, we can freely mix and match block-like state.
						inside_block_like_struct_scope =
						    has_member_decoration(type.self, subconstant_index, DecorationOffset);
					}

					if (type.basetype == SPIRType::Struct)
						inside_struct_scope = true;

					res += constant_expression(subc, inside_block_like_struct_scope, inside_struct_scope);
				}
			}

			if (&elem != &c.subconstants.back())
				res += ", ";

			subconstant_index++;
		}

		res += backend.use_initializer_list ? " }" : ")";
		if (needs_trailing_tracket)
			res += ")";

		return res;
	}
	else if (type.basetype == SPIRType::Struct && type.member_types.size() == 0)
	{
		// Metal tessellation likes empty structs which are then constant expressions.
		if (backend.supports_empty_struct)
			return "{ }";
		else if (backend.use_typed_initializer_list)
			return join(type_to_glsl(type), "{ 0 }");
		else if (backend.use_initializer_list)
			return "{ 0 }";
		else
			return join(type_to_glsl(type), "(0)");
	}
	else if (c.columns() == 1)
	{
		auto res = constant_expression_vector(c, 0);

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
	else
	{
		string res = type_to_glsl(type) + "(";
		for (uint32_t col = 0; col < c.columns(); col++)
		{
			if (c.specialization_constant_id(col) != 0)
				res += to_name(c.specialization_constant_id(col));
			else
				res += constant_expression_vector(c, col);

			if (col + 1 < c.columns())
				res += ", ";
		}
		res += ")";

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
}